

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::opimb_approx(Alg *this,Graph *graph,double budget,
                 vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                 int mode)

{
  uint uVar1;
  TResult *pTVar2;
  undefined1 auVar3 [12];
  Alg *pAVar4;
  HyperGraph *this_00;
  char cVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t numSamples;
  Graph *graph_00;
  byte bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double timeb;
  char local_169;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  double local_108;
  double local_100;
  vector<double,_std::allocator<double>_> *local_f8;
  int local_ec;
  Alg *local_e8;
  ulong local_e0;
  double local_d8;
  Nodelist *local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  long local_98;
  double local_90;
  double local_88;
  double local_80;
  HyperGraph *local_78;
  HyperGraph *local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_118._8_8_ = local_118._0_8_;
  local_118._0_8_ = delta;
  local_158 = epsilon;
  local_100 = budget;
  local_f8 = budget_list;
  lVar7 = std::chrono::_V2::system_clock::now();
  local_150 = 6.0 / (double)local_118._0_8_;
  local_148 = log(local_150);
  if (local_148 < 0.0) {
    local_148 = sqrt(local_148);
  }
  else {
    local_148 = SQRT(local_148);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,local_f8);
  iVar6 = cal_k_max(&local_48,local_100);
  local_e8 = this;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,local_f8);
  cal_k_min(&local_60,local_100);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pAVar4 = local_e8;
  dVar14 = (double)local_e8->__numV;
  local_128 = dVar14 + dVar14;
  uStack_120 = 0.0;
  local_168 = (double)iVar6;
  local_160 = log(dVar14);
  dVar14 = log(local_150);
  dVar14 = (local_160 * local_168 + dVar14) * local_158;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  local_148 = local_148 * local_158;
  dVar15 = (double)pAVar4->__numV;
  dVar14 = (local_128 * (dVar14 + local_148) * (dVar14 + local_148)) / dVar15;
  local_e0 = (ulong)dVar14;
  local_e0 = (long)(dVar14 - 9.223372036854776e+18) & (long)local_e0 >> 0x3f | local_e0;
  local_128 = dVar15 + dVar15;
  uStack_120 = 0.0;
  local_160 = log(dVar15);
  dVar14 = log(local_150);
  dVar14 = (local_160 * local_168 + dVar14) * local_158;
  local_98 = lVar7;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar14 = (local_128 * (local_148 + dVar14) * (local_148 + dVar14)) /
           (local_158 * local_158 * local_168);
  uVar11 = (ulong)dVar14;
  bVar13 = 0;
  uVar11 = ((long)(dVar14 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11) / local_e0;
  auVar19._8_4_ = (int)(uVar11 >> 0x20);
  auVar19._0_8_ = uVar11;
  auVar19._12_4_ = 0x45300000;
  local_ec = mode;
  dVar14 = log((auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0));
  uVar11 = (ulong)(dVar14 / 0.6931471805599453);
  local_68 = ((long)(dVar14 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f |
             uVar11) + 1;
  auVar20._8_4_ = (int)((ulong)local_68 >> 0x20);
  auVar20._0_8_ = local_68;
  auVar20._12_4_ = 0x45300000;
  dStack_140 = auVar20._8_8_ - 1.9342813113834067e+25;
  local_148 = ((dStack_140 + ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) *
              3.0) / (double)local_118._0_8_;
  local_108 = log(local_148);
  local_150 = log(local_148);
  local_c0 = 0.0;
  local_70 = &pAVar4->__hyperG;
  local_78 = &pAVar4->__hyperGVldt;
  local_d0 = &pAVar4->__vecSeed;
  local_80 = (local_108 + local_108) / 9.0;
  local_c8 = local_108 * 0.5;
  local_150 = local_150 * 0.5;
  local_128 = 0.0;
  uStack_120 = 0.0;
  local_88 = SQRT(local_c8);
  local_90 = SQRT(local_150);
  local_160 = (double)((ulong)local_160 & 0xffffffff00000000);
  local_108 = local_108 / 18.0;
  while( true ) {
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    numSamples = local_e0 << (bVar13 & 0x3f);
    lVar7 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_70,numSamples);
    this_00 = local_78;
    HyperGraph::build_n_RRsets(local_78,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar5;
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pAVar4 = local_e8;
    local_e8->__numRRsets = (local_e8->__hyperG).__numRRsets;
    lVar9 = std::chrono::_V2::system_clock::now();
    iVar6 = local_ec;
    local_168 = max_cover_lazy_budget(pAVar4,graph_00,local_100,local_f8,&local_c0,local_ec);
    lVar10 = std::chrono::_V2::system_clock::now();
    auVar23._0_8_ = (double)(lVar10 - lVar9);
    auVar23._8_8_ = (double)(lVar9 - lVar7);
    local_118 = divpd(auVar23,_DAT_00132110);
    local_d8 = HyperGraph::self_inf_cal(this_00,local_d0);
    auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)pAVar4->__numRRsets);
    auVar21._8_4_ = (int)(pAVar4->__numRRsets >> 0x20);
    auVar21._12_4_ = 0x45300000;
    dVar14 = auVar21._8_8_ - 1.9342813113834067e+25;
    local_130 = local_168 / local_158;
    local_148 = local_130;
    if (iVar6 == 2) {
      if (pAVar4->__is_inf_cost == true) {
        if (pAVar4->__boundMin_inf_cost <= local_130) {
          local_148 = pAVar4->__boundMin_inf_cost;
        }
      }
      else {
        local_148 = pAVar4->__boundMin_inf;
      }
    }
    else if (iVar6 == 1) {
      local_148 = pAVar4->__boundLast_inf;
      if (pAVar4->__boundLast_inf <= pAVar4->__boundLast_inf_cost) {
        local_148 = pAVar4->__boundLast_inf_cost;
      }
    }
    local_a8._8_4_ = SUB84(dVar14,0);
    local_a8._0_8_ =
         ((dVar14 + (auVar21._0_8_ - 4503599627370496.0)) * local_d8) / (double)pAVar4->__numV +
         local_80;
    local_a8._12_4_ = (int)((ulong)dVar14 >> 0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"========upper bound ratio: ",0x1b);
    poVar8 = std::ostream::_M_insert<double>(local_148 / local_130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"========",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)pAVar4->__numRRsets);
    auVar22._8_4_ = (int)(pAVar4->__numRRsets >> 0x20);
    auVar22._12_4_ = 0x45300000;
    local_b8 = auVar22._0_8_ - 4503599627370496.0;
    dStack_b0 = auVar22._8_8_ - 1.9342813113834067e+25;
    uVar1 = pAVar4->__numV;
    if ((double)local_a8._0_8_ < 0.0) {
      dVar14 = sqrt((double)local_a8._0_8_);
    }
    else {
      dVar14 = SQRT((double)local_a8._0_8_);
    }
    local_a8._0_8_ = dVar14;
    dVar14 = local_88;
    if (local_c8 < 0.0) {
      dVar14 = sqrt(local_c8);
    }
    dVar15 = ((dStack_b0 + local_b8) * local_148) / (double)uVar1 + local_150;
    local_130 = dVar14;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dVar14 = local_90;
    if (local_150 < 0.0) {
      local_b8 = dVar15;
      dVar14 = sqrt(local_150);
      dVar15 = local_b8;
    }
    local_128 = local_128 + (double)local_118._0_8_;
    uStack_120 = uStack_120 + (double)local_118._8_8_;
    dVar18 = ((double)local_a8._0_8_ - local_130) * ((double)local_a8._0_8_ - local_130) - local_108
    ;
    dVar16 = 0.0;
    if (0.0 <= dVar18) {
      dVar16 = dVar18;
    }
    local_118._0_8_ = dVar16 / ((dVar15 + dVar14) * (dVar15 + dVar14));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-APPROX (",0x13);
    bVar13 = bVar13 + 1;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") approx. (max-cover): ",0x17);
    poVar8 = std::ostream::_M_insert<double>((double)local_118._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
    poVar8 = std::ostream::_M_insert<double>(local_168 / local_148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"), #RR sets: ",0xd);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    local_169 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_169,1);
    if ((local_158 <= (double)local_118._0_8_) && (local_160._0_4_ == 1)) break;
    iVar6 = local_160._0_4_;
    if (local_160._0_4_ == 0) {
      iVar6 = 1;
    }
    iVar12 = local_160._0_4_;
    if (local_158 <= (double)local_118._0_8_) {
      iVar12 = iVar6;
    }
    local_160 = (double)CONCAT44(local_160._4_4_,iVar12);
  }
  pTVar2 = pAVar4->__tRes;
  pTVar2->__Approx = (double)local_118._0_8_;
  lVar7 = std::chrono::_V2::system_clock::now();
  pTVar2->__RunningTime = (double)(lVar7 - local_98) / 1000000000.0;
  pTVar2 = pAVar4->__tRes;
  pTVar2->__Influence = local_d8;
  pTVar2->__InfluenceOriginal = local_168;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&pTVar2->__VecSeed,local_d0);
  pTVar2->__SeedSize =
       (int)((ulong)((long)(pAVar4->__vecSeed).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pAVar4->__vecSeed).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pAVar4->__tRes->__VecSeed_inf,&pAVar4->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pAVar4->__tRes->__VecSeed_inf_cost,&pAVar4->__vecSeed_inf_cost);
  pTVar2 = pAVar4->__tRes;
  pTVar2->__BoundMin_inf = pAVar4->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = pAVar4->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = pAVar4->__numRRsets * 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
  poVar8 = std::ostream::_M_insert<double>(local_d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", time: ",8);
  poVar8 = std::ostream::_M_insert<double>(pAVar4->__tRes->__RunningTime);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_169,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
  auVar3._4_8_ = extraout_XMM0_Qb;
  auVar3._0_4_ = local_128._4_4_;
  auVar17._0_8_ = auVar3._0_8_ << 0x20;
  auVar17._8_4_ = (undefined4)uStack_120;
  auVar17._12_4_ = uStack_120._4_4_;
  poVar8 = std::ostream::_M_insert<double>(auVar17._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  local_148 = local_c0;
  poVar8 = std::ostream::_M_insert<double>(local_128 - local_c0);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_169,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
  poVar8 = std::ostream::_M_insert<double>(local_148);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_169,1);
  return 0.0;
}

Assistant:

double Alg::opimb_approx(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-APPROX");
    const double approx = epsilon;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-APPROX (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}